

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap2Local.cpp
# Opt level: O3

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::anon_unknown_100::Heap2Local::create(Heap2Local *this)

{
  _func_int **__s;
  
  __s = (_func_int **)operator_new(0x108);
  memset(__s,0,0xe0);
  __s[2] = (_func_int *)(__s + 4);
  __s[6] = (_func_int *)0x0;
  __s[7] = (_func_int *)0x0;
  __s[0x1c] = (_func_int *)0x0;
  __s[0x1d] = (_func_int *)0x0;
  __s[0x1e] = (_func_int *)0x0;
  __s[0x1f] = (_func_int *)0x0;
  __s[0x20] = (_func_int *)0x0;
  *__s = (_func_int *)&PTR__WalkerPass_00d73e28;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Heap2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2Local,_void>_>_>
  ).super_Pass._vptr_Pass = __s;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<Heap2Local>();
  }